

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdGetPrivkeyFromWif(void *handle,char *wif,int network_type,char **privkey)

{
  bool bVar1;
  NetType net_type;
  size_t sVar2;
  char *pcVar3;
  CfdException *pCVar4;
  bool is_bitcoin;
  Privkey key;
  bool local_72;
  allocator local_71;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  cfd::Initialize();
  if (privkey == (char **)0x0) {
    local_70._0_8_ = "cfdcapi_key.cpp";
    local_70._8_4_ = 0x420;
    local_60._M_allocated_capacity = 0x620211;
    cfd::core::logger::log<>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"privkey is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Failed to parameter. privkey is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(wif);
  if (!bVar1) {
    sVar2 = strnlen(wif,0x34);
    local_72 = true;
    net_type = cfd::capi::ConvertNetType(network_type,&local_72);
    if (local_72 != false) {
      std::__cxx11::string::string((string *)&local_50,wif,&local_71);
      cfd::core::Privkey::FromWif((Privkey *)local_70,&local_50,net_type,sVar2 != 0x33);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_50,(Privkey *)local_70);
      pcVar3 = cfd::capi::CreateString(&local_50);
      *privkey = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_70._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_70._0_8_,local_60._M_allocated_capacity - local_70._0_8_);
      }
      return 0;
    }
    local_70._0_8_ = "cfdcapi_key.cpp";
    local_70._8_4_ = 0x430;
    local_60._M_allocated_capacity = 0x620211;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
               "privkey\'s network_type is invalid.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Failed to parameter. privkey\'s network_type is invalid.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcapi_key.cpp";
  local_70._8_4_ = 0x426;
  local_60._M_allocated_capacity = 0x620211;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"wif is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._0_8_ = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Failed to parameter. wif is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyFromWif(
    void* handle, const char* wif, int network_type, char** privkey) {
  try {
    cfd::Initialize();
    if (privkey == nullptr) {
      warn(CFD_LOG_SOURCE, "privkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null.");
    }
    if (IsEmptyString(wif)) {
      warn(CFD_LOG_SOURCE, "wif is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. wif is null or empty.");
    }

    size_t wif_len = strnlen(wif, kPrivkeyWifUncompressSize + 1);
    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    Privkey key = Privkey::FromWif(
        wif, net_type, (wif_len != kPrivkeyWifUncompressSize));
    *privkey = CreateString(key.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}